

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

void __thiscall mpt::layout::bind(layout *this)

{
  socklen_t in_ECX;
  sockaddr *in_RDX;
  int in_ESI;
  
  bind((layout *)&this[-1]._font,in_ESI,in_RDX,in_ECX);
  return;
}

Assistant:

int layout::bind(const relation *rel, logger *out)
{
	item_array<metatype> old = _items;
	int ret = 0;
	
	if (!rel) {
		collection::relation me(*this);
		ret = item_group::bind(&me, out);
	} else {
		ret = item_group::bind(rel, out);
	}
	if (ret < 0) {
		return ret;
	}
	item_array<graph> arr;
	
	for (auto &it : _items) {
		metatype *mt;
		graph *g;
		if (!(mt = it.instance()) || !(g = *mt)) {
			continue;
		}
		const char *name = it.name();
		if (!g->addref()) {
			static const char _func[] = "mpt::layout::bind\0";
			::mpt::graph *d;
			object *o = 0;
			if (!(d = *mt) || !(o = *mt)) {
				const char *msg = MPT_tr("unable to get graph information");
				if (out) {
					if (!name || !*name) {
						out->message(_func, out->Warning, "%s", msg);
					} else {
						out->message(_func, out->Warning, "%s: %s", msg, name);
					}
				}
				continue;
			}
			g = new graph(d);
			
			if (o && !g->set(*o, out)) {
				g->unref();
				continue;
			}
		}
		if (!arr.append(g, name)) {
			g->unref();
			_items = old;
			return false;
		}
	}
	_graphs = arr;
	return true;
}